

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm-functions.cpp
# Opt level: O0

size_t arangodb::velocypack::anon_unknown_0::JSONStringCopyCheckUtf8C
                 (uint8_t *dst,uint8_t *src,size_t limit)

{
  bool bVar1;
  uint8_t *end;
  size_t limit_local;
  uint8_t *src_local;
  uint8_t *dst_local;
  
  src_local = src;
  dst_local = dst;
  while( true ) {
    bVar1 = false;
    if ((((src_local < src + limit) && (bVar1 = false, 0x1f < *src_local)) &&
        (bVar1 = false, *src_local != '\\')) && (bVar1 = false, *src_local != '\"')) {
      bVar1 = *src_local < 0x80;
    }
    if (!bVar1) break;
    *dst_local = *src_local;
    src_local = src_local + 1;
    dst_local = dst_local + 1;
  }
  return limit - ((long)(src + limit) - (long)src_local);
}

Assistant:

inline std::size_t JSONStringCopyCheckUtf8C(uint8_t* dst, uint8_t const* src,
                                            std::size_t limit) {
  // Copy up to limit uint8_t from src to dst.
  // Stop at the first control character or backslash or double quote.
  // Also stop at byte with high bit set.
  // Report the number of bytes copied. May copy less bytes, for example
  // for alignment reasons.
  uint8_t const* end = src + limit;
  while (src < end && *src >= 32 && *src != '\\' && *src != '"' &&
         *src < 0x80) {
    *dst++ = *src++;
  }
  return limit - (end - src);
}